

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error externalEntityInitProcessor2(XML_Parser parser,char *start,char *end,char **endPtr)

{
  int iVar1;
  XML_Error XVar2;
  char *in_RAX;
  char *next;
  
  iVar1 = (**(code **)(*(long *)((long)parser + 0x118) + 8))();
  if (iVar1 == -2) {
    if (endPtr == (char **)0x0) {
      *(char **)((long)parser + 0x218) = start;
      return XML_ERROR_PARTIAL_CHAR;
    }
  }
  else {
    if (iVar1 != -1) {
      if (iVar1 == 0xe) {
        start = in_RAX;
      }
      *(code **)((long)parser + 0x208) = externalEntityInitProcessor3;
      XVar2 = externalEntityInitProcessor3(parser,start,end,endPtr);
      return XVar2;
    }
    if (endPtr == (char **)0x0) {
      *(char **)((long)parser + 0x218) = start;
      return XML_ERROR_UNCLOSED_TOKEN;
    }
  }
  *endPtr = start;
  return XML_ERROR_NONE;
}

Assistant:

static
enum XML_Error externalEntityInitProcessor2(XML_Parser parser,
                                            const char *start,
                                            const char *end,
                                            const char **endPtr)
{
  const char *next;
  int tok = XmlContentTok(encoding, start, end, &next);
  switch (tok) {
  case XML_TOK_BOM:
    start = next;
    break;
  case XML_TOK_PARTIAL:
    if (endPtr) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    eventPtr = start;
    return XML_ERROR_UNCLOSED_TOKEN;
  case XML_TOK_PARTIAL_CHAR:
    if (endPtr) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    eventPtr = start;
    return XML_ERROR_PARTIAL_CHAR;
  }
  processor = externalEntityInitProcessor3;
  return externalEntityInitProcessor3(parser, start, end, endPtr);
}